

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::x86::Assembler::onAttach(Assembler *this,CodeHolder *code)

{
  Arch AVar1;
  Error EVar2;
  
  AVar1 = (code->_environment)._arch;
  EVar2 = BaseAssembler::onAttach(&this->super_BaseAssembler,code);
  if (EVar2 == 0) {
    (this->super_BaseAssembler).super_BaseEmitter._instructionAlignment = '\x01';
    assignEmitterFuncs((BaseEmitter *)this);
    (this->super_BaseAssembler).super_BaseEmitter._forcedInstOptions =
         (uint)AVar1 << 0x1f |
         (this->super_BaseAssembler).super_BaseEmitter._forcedInstOptions & ~kX86_InvalidRex;
    (this->super_BaseAssembler).super_BaseEmitter._privateData =
         (uint)((AVar1 & k32BitMask) == kUnknown) * 0x40 + 0x40;
  }
  return EVar2;
}

Assistant:

Error Assembler::onAttach(CodeHolder* code) noexcept {
  Arch arch = code->arch();
  ASMJIT_PROPAGATE(Base::onAttach(code));

  _instructionAlignment = uint8_t(1);
  assignEmitterFuncs(this);

  if (Environment::is32Bit(arch)) {
    // 32 bit architecture - X86.
    _forcedInstOptions |= InstOptions::kX86_InvalidRex;
    _setAddressOverrideMask(kX86MemInfo_67H_X86);
  }
  else {
    // 64 bit architecture - X64.
    _forcedInstOptions &= ~InstOptions::kX86_InvalidRex;
    _setAddressOverrideMask(kX86MemInfo_67H_X64);
  }

  return kErrorOk;
}